

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
redux<Eigen::internal::scalar_sum_op<double,double>>
          (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,scalar_sum_op<double,_double> *func)

{
  bool bVar1;
  Index IVar2;
  Matrix<double,__1,__1,_0,__1,__1> *xpr;
  Scalar SVar3;
  undefined1 local_30 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<double,_double> *func_local;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  thisEval.m_xpr = (XprType *)func;
  IVar2 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Redux.h"
                  ,0x19d,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, -1>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                 );
  }
  xpr = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived
                  ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this);
  internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::redux_evaluator
            ((redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_30,xpr);
  SVar3 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
          ::run((redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_30,
                (scalar_sum_op<double,_double> *)thisEval.m_xpr);
  internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~redux_evaluator
            ((redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_30);
  return SVar3;
}

Assistant:

EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());
  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func);
}